

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

uint32_t av1_write_obu_header
                   (AV1LevelParams *level_params,int *frame_header_count,OBU_TYPE obu_type,
                   _Bool has_nonzero_operating_point_idc,_Bool is_layer_specific_obu,
                   int obu_extension,uint8_t *dst)

{
  byte local_25;
  int obu_has_size_field;
  int obu_extension_flag;
  uint32_t size;
  int obu_extension_local;
  _Bool is_layer_specific_obu_local;
  _Bool has_nonzero_operating_point_idc_local;
  OBU_TYPE obu_type_local;
  int *frame_header_count_local;
  AV1LevelParams *level_params_local;
  
  if ((level_params->keep_level_stats != 0) &&
     ((obu_type == OBU_FRAME || (obu_type == OBU_FRAME_HEADER)))) {
    *frame_header_count = *frame_header_count + 1;
  }
  local_25 = 0;
  if (has_nonzero_operating_point_idc) {
    local_25 = is_layer_specific_obu;
  }
  *dst = obu_type << 3 | (local_25 & 1) << 2 | 2;
  size = 1;
  if ((local_25 & 1) != 0) {
    dst[1] = (uint8_t)obu_extension;
    size = 2;
  }
  return size;
}

Assistant:

uint32_t av1_write_obu_header(AV1LevelParams *const level_params,
                              int *frame_header_count, OBU_TYPE obu_type,
                              bool has_nonzero_operating_point_idc,
                              bool is_layer_specific_obu, int obu_extension,
                              uint8_t *const dst) {
  assert(IMPLIES(!has_nonzero_operating_point_idc, obu_extension == 0));

  if (level_params->keep_level_stats &&
      (obu_type == OBU_FRAME || obu_type == OBU_FRAME_HEADER))
    ++(*frame_header_count);

  uint32_t size = 0;

  // The AV1 spec draft version (as of git commit 5e04f)
  // has the following requirements on the OBU extension header:
  //
  // 6.4.1. General sequence header OBU semantics:
  //   If operating_point_idc[ op ] is not equal to 0 for any value of op from 0
  //   to operating_points_cnt_minus_1, it is a requirement of bitstream
  //   conformance that obu_extension_flag is equal to 1 for all layer-specific
  //   OBUs in the coded video sequence.
  //   (...)
  //   It is a requirement of bitstream conformance that if OperatingPointIdc
  //   is equal to 0, then obu_extension_flag is equal to 0 for all OBUs that
  //   follow this sequence header until the next sequence header.
  //
  // Set obu_extension_flag to satisfy these requirements.
  const int obu_extension_flag =
      has_nonzero_operating_point_idc && is_layer_specific_obu;
  const int obu_has_size_field = 1;

  dst[0] = ((int)obu_type << 3) | (obu_extension_flag << 2) |
           (obu_has_size_field << 1);
  size++;

  if (obu_extension_flag) {
    dst[1] = obu_extension & 0xFF;
    size++;
  }

  return size;
}